

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O3

XmlNodePtr __thiscall libcellml::XmlNode::firstChild(XmlNode *this)

{
  _Alloc_hider this_00;
  size_type sVar1;
  size_type sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  xmlNodePtr pxVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 *in_RSI;
  XmlNodePtr XVar4;
  undefined1 local_61;
  XmlNode *local_60;
  string local_58;
  
  pxVar3 = *(xmlNodePtr *)(*(long *)*in_RSI + 0x18);
  this->mPimpl = (XmlNodeImpl *)0x0;
  this[1].mPimpl = (XmlNodeImpl *)0x0;
  if (pxVar3 != (xmlNodePtr)0x0) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_60 = this;
    while( true ) {
      local_58._M_dataplus._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<libcellml::XmlNode,std::allocator<libcellml::XmlNode>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length,
                 (XmlNode **)&local_58,(allocator<libcellml::XmlNode> *)&local_61);
      sVar1 = local_58._M_string_length;
      this_00._M_p = local_58._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      in_RDX._M_pi = extraout_RDX;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        in_RDX._M_pi = extraout_RDX_00;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
          in_RDX._M_pi = extraout_RDX_01;
        }
      }
      (*(XmlNodeImpl **)this_00._M_p)->mXmlNodePtr = pxVar3;
      if (pxVar3->type != XML_TEXT_NODE) break;
      convertToStrippedString_abi_cxx11_(&local_58,(XmlNode *)this_00._M_p);
      sVar2 = local_58._M_string_length;
      in_RDX._M_pi = extraout_RDX_02;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        in_RDX._M_pi = extraout_RDX_03;
      }
      if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2 !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (pxVar3 = pxVar3->next, this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1,
         pxVar3 == (_xmlNode *)0x0)) break;
    }
    local_60[1].mPimpl = (XmlNodeImpl *)sVar1;
    local_60->mPimpl = (XmlNodeImpl *)this_00._M_p;
    this = local_60;
  }
  XVar4.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  XVar4.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (XmlNodePtr)XVar4.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr XmlNode::firstChild() const
{
    xmlNodePtr child = mPimpl->mXmlNodePtr->children;
    XmlNodePtr childHandle = nullptr;
    while (child != nullptr) {
        childHandle = std::make_shared<XmlNode>();
        childHandle->setXmlNode(child);
        bool textNode = childHandle->isText();
        if (!textNode || !childHandle->convertToStrippedString().empty()) {
            break;
        }
        child = child->next;
    }
    return childHandle;
}